

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O3

size_t __thiscall henson::Scheduler::find_available_procs(Scheduler *this,size_t num_procs)

{
  ulong uVar1;
  _Bit_type *p_Var2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  
  p_Var2 = (this->available_procs_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar1 = (ulong)(this->available_procs_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
          ((long)(this->available_procs_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var2) *
          8;
  if (1 < uVar1) {
    sVar3 = 2 - num_procs;
    uVar5 = 1;
    sVar6 = 0;
    do {
      uVar7 = uVar5 + 0x3f;
      if (-1 < (long)uVar5) {
        uVar7 = uVar5;
      }
      sVar4 = sVar6 + 1;
      sVar6 = 0;
      if ((p_Var2[((long)uVar7 >> 6) +
                  (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff]
           >> (uVar5 & 0x3f) & 1) != 0) {
        sVar6 = sVar4;
      }
      if (sVar6 == num_procs) {
        return sVar3;
      }
      uVar5 = uVar5 + 1;
      sVar3 = sVar3 + 1;
    } while (uVar5 < uVar1);
  }
  return uVar1;
}

Assistant:

size_t  find_available_procs(size_t num_procs)
        {
            size_t procs = 0;
            for(size_t i = 1; i < available_procs_.size(); ++i)
            {
                if (available_procs_[i])
                    procs++;
                else
                    procs = 0;

                if (procs == num_procs)
                    return i - (procs - 1);
            }

            return available_procs_.size();
        }